

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_test.cc
# Opt level: O0

void __thiscall get_proj_subspace_test_lowbd::GetProjSubspaceTest::SetUp(GetProjSubspaceTest *this)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<void_(*const)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_int_*,_int,_int_*,_int,_long_(*)[2],_long_*,_const_sgr_params_type_*)>_>
  *pp_Var2;
  void *pvVar3;
  char *in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_ffffffffffffff20;
  int **in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  int line;
  char *in_stack_ffffffffffffff40;
  Type in_stack_ffffffffffffff4c;
  AssertHelper *in_stack_ffffffffffffff50;
  AssertHelper *this_00;
  AssertionResult local_a8 [2];
  undefined8 local_88;
  AssertionResult local_80;
  Message *in_stack_ffffffffffffff98;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertHelper *this_01;
  AssertionResult local_58;
  uint local_44;
  undefined8 local_20;
  AssertionResult local_18;
  
  testing::
  WithParamInterface<std::tuple<void_(*const)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_int_*,_int,_int_*,_int,_long_(*)[2],_long_*,_const_sgr_params_type_*)>_>
  ::GetParam();
  pp_Var2 = std::
            get<0ul,void(*const)(unsigned_char_const*,int,int,int,unsigned_char_const*,int,int*,int,int*,int,long(*)[2],long*,sgr_params_type_const*)>
                      ((tuple<void_(*const)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_int_*,_int,_int_*,_int,_long_(*)[2],_long_*,_const_sgr_params_type_*)>
                        *)0xbef709);
  *(__tuple_element_t<0UL,_tuple<void_(*const)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_int_*,_int,_int_*,_int,_long_(*)[2],_long_*,_const_sgr_params_type_*)>_>
    *)(in_RDI + 0x18) = *pp_Var2;
  pvVar3 = aom_malloc(0xbef722);
  *(void **)(in_RDI + 0x28) = pvVar3;
  local_20 = 0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            (in_RDI,in_stack_ffffffffffffff30,(uchar **)in_stack_ffffffffffffff28,
             &in_stack_ffffffffffffff20->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff30 =
         testing::AssertionResult::failure_message((AssertionResult *)0xbef792);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
               (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff30);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
    testing::Message::~Message((Message *)0xbef7ef);
  }
  local_44 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbef876);
  if (local_44 == 0) {
    pvVar3 = aom_malloc(0xbef892);
    *(void **)(in_RDI + 0x30) = pvVar3;
    this_01 = (AssertHelper *)0x0;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              (in_RDI,in_stack_ffffffffffffff30,(uchar **)in_stack_ffffffffffffff28,
               &in_stack_ffffffffffffff20->data_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff28 =
           (int **)testing::AssertionResult::failure_message((AssertionResult *)0xbef914);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
                 (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff30);
      testing::internal::AssertHelper::operator=(this_01,in_stack_ffffffffffffff98);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
      testing::Message::~Message((Message *)0xbef968);
    }
    local_44 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbef9e9);
    if (local_44 == 0) {
      pvVar3 = aom_malloc(0xbefa05);
      *(void **)(in_RDI + 0x38) = pvVar3;
      local_88 = 0;
      testing::internal::CmpHelperNE<int*,decltype(nullptr)>
                (in_RDI,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 &in_stack_ffffffffffffff20->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_80);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff50);
        in_stack_ffffffffffffff20 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xbefa75);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
                   (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff30);
        testing::internal::AssertHelper::operator=(this_01,in_stack_ffffffffffffff98);
        testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
        testing::Message::~Message((Message *)0xbefac3);
      }
      local_44 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xbefb3e);
      if (local_44 == 0) {
        pvVar3 = aom_malloc(0xbefb5a);
        *(void **)(in_RDI + 0x40) = pvVar3;
        this_00 = (AssertHelper *)0x0;
        testing::internal::CmpHelperNE<int*,decltype(nullptr)>
                  (in_RDI,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   &in_stack_ffffffffffffff20->data_);
        line = (int)((ulong)in_RDI >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
        if (!bVar1) {
          testing::Message::Message((Message *)this_00);
          testing::AssertionResult::failure_message((AssertionResult *)0xbefbc7);
          testing::internal::AssertHelper::AssertHelper
                    (this_00,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,line,
                     in_stack_ffffffffffffff30);
          testing::internal::AssertHelper::operator=(this_01,in_stack_ffffffffffffff98);
          testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
          testing::Message::~Message((Message *)0xbefc13);
        }
        local_44 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0xbefc8b);
      }
    }
  }
  return;
}

Assistant:

void SetUp() override {
    target_func_ = GET_PARAM(0);
    src_ = (uint8_t *)(aom_malloc(MAX_DATA_BLOCK * MAX_DATA_BLOCK *
                                  sizeof(*src_)));
    ASSERT_NE(src_, nullptr);
    dgd_ = (uint8_t *)(aom_malloc(MAX_DATA_BLOCK * MAX_DATA_BLOCK *
                                  sizeof(*dgd_)));
    ASSERT_NE(dgd_, nullptr);
    flt0_ = (int32_t *)(aom_malloc(MAX_DATA_BLOCK * MAX_DATA_BLOCK *
                                   sizeof(*flt0_)));
    ASSERT_NE(flt0_, nullptr);
    flt1_ = (int32_t *)(aom_malloc(MAX_DATA_BLOCK * MAX_DATA_BLOCK *
                                   sizeof(*flt1_)));
    ASSERT_NE(flt1_, nullptr);
  }